

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_index_list.cpp
# Opt level: O2

bool duckdb::IsForeignKeyIndex
               (vector<duckdb::PhysicalIndex,_true> *fk_keys,Index *index,ForeignKeyType fk_type)

{
  pointer pPVar1;
  pointer puVar2;
  pointer puVar3;
  unsigned_long uVar4;
  IndexConstraintType index_constraint_type;
  int iVar5;
  pointer pPVar6;
  undefined7 in_register_00000011;
  pointer puVar7;
  
  iVar5 = (*index->_vptr_Index[5])(index);
  if ((int)CONCAT71(in_register_00000011,fk_type) == 0) {
    if (1 < (byte)((char)iVar5 - 1U)) {
      return false;
    }
  }
  else if ((char)iVar5 != '\x03') {
    return false;
  }
  pPVar6 = (fk_keys->super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>).
           super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl
           .super__Vector_impl_data._M_start;
  pPVar1 = (fk_keys->super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>).
           super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>._M_impl
           .super__Vector_impl_data._M_finish;
  puVar2 = (index->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (index->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)pPVar1 - (long)pPVar6 != (long)puVar3 - (long)puVar2) {
    return false;
  }
  do {
    puVar7 = puVar2;
    if (pPVar6 == pPVar1) {
      return true;
    }
    do {
      if (puVar7 == puVar3) {
        return false;
      }
      uVar4 = *puVar7;
      puVar7 = puVar7 + 1;
    } while (pPVar6->index != uVar4);
    pPVar6 = pPVar6 + 1;
  } while( true );
}

Assistant:

bool IsForeignKeyIndex(const vector<PhysicalIndex> &fk_keys, Index &index, ForeignKeyType fk_type) {
	if (fk_type == ForeignKeyType::FK_TYPE_PRIMARY_KEY_TABLE ? !index.IsUnique() : !index.IsForeign()) {
		return false;
	}
	if (fk_keys.size() != index.GetColumnIds().size()) {
		return false;
	}

	auto &column_ids = index.GetColumnIds();
	for (auto &fk_key : fk_keys) {
		bool found = false;
		for (auto &index_key : column_ids) {
			if (fk_key.index == index_key) {
				found = true;
				break;
			}
		}
		if (!found) {
			return false;
		}
	}
	return true;
}